

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_errors(vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors)

{
  pointer pEVar1;
  enableStd<rang::style> pbVar2;
  enableStd<rang::bg> pbVar3;
  char *__s;
  size_t sVar4;
  ErrorInfoException *it;
  pointer pEVar5;
  
  pbVar2 = rang::operator<<((ostream *)&std::cout,bold);
  pbVar3 = rang::operator<<(pbVar2,red);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,anon_var_dwarf_534f,0xc);
  pbVar2 = rang::operator<<(pbVar3,reset);
  pbVar3 = rang::operator<<(pbVar2,reset);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
  std::ostream::put((char)pbVar3);
  std::ostream::flush();
  rang::operator<<((ostream *)&std::cout,red);
  pEVar1 = (errors->super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (errors->super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>
                )._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    __s = (char *)(**(code **)(*(long *)pEVar5 + 0x10))(pEVar5);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1121b0);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  rang::operator<<((ostream *)&std::cout,reset);
  return;
}

Assistant:

void print_errors(const vector<ErrorInfoException> &errors) {
    cout << style::bold << bg::red << "\t\t\t错误表" << style::reset << bg::reset << endl;
    cout << fg::red;
    for (const auto &it : errors) {
        cout << it.what() << endl;
    }
    cout << fg::reset;
}